

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O1

uint64_t absl::lts_20250127::log_internal::anon_unknown_4::DecodeVarint(Span<const_char> *buf)

{
  byte *pbVar1;
  ulong uVar2;
  uint64_t uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar2 = buf->len_;
  bVar4 = 0;
  uVar3 = 0;
  uVar5 = 0;
  do {
    uVar6 = uVar2;
    if (uVar2 == uVar5) break;
    pbVar1 = (byte *)(buf->ptr_ + uVar5);
    uVar3 = uVar3 | (ulong)(*pbVar1 & 0x7f) << (bVar4 & 0x3f);
    uVar6 = uVar5 + 1;
    bVar4 = bVar4 + 7;
    uVar5 = uVar6;
  } while ((char)*pbVar1 < '\0');
  if (uVar2 < uVar6) {
    _GLOBAL__N_1::DecodeVarint();
    return 0;
  }
  buf->ptr_ = buf->ptr_ + uVar6;
  buf->len_ = uVar2 - uVar6;
  return uVar3;
}

Assistant:

uint64_t DecodeVarint(absl::Span<const char> *buf) {
  uint64_t value = 0;
  size_t s = 0;
  while (s < buf->size()) {
    value |= static_cast<uint64_t>(static_cast<unsigned char>((*buf)[s]) & 0x7f)
             << 7 * s;
    if (!((*buf)[s++] & 0x80)) break;
  }
  buf->remove_prefix(s);
  return value;
}